

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_rfe(DisasContext_conflict1 *s,TCGv_i32 pc,TCGv_i32 cpsr)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  store_pc_exc_ret((DisasContext_conflict1 *)tcg_ctx,pc);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = (TCGTemp *)(cpsr + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_cpsr_write_eret_aarch64,(TCGTemp *)0x0,2,&local_28);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(cpsr + (long)tcg_ctx));
  (s->base).is_jmp = DISAS_TARGET_9;
  return;
}

Assistant:

static void gen_rfe(DisasContext *s, TCGv_i32 pc, TCGv_i32 cpsr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    store_pc_exc_ret(s, pc);
    /* The cpsr_write_eret helper will mask the low bits of PC
     * appropriately depending on the new Thumb bit, so it must
     * be called after storing the new PC.
     */
    if (tb_cflags(s->base.tb) & CF_USE_ICOUNT) {
        // gen_io_start(tcg_ctx);
    }
    gen_helper_cpsr_write_eret(tcg_ctx, tcg_ctx->cpu_env, cpsr);
    tcg_temp_free_i32(tcg_ctx, cpsr);
    /* Must exit loop to check un-masked IRQs */
    s->base.is_jmp = DISAS_EXIT;
}